

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O1

void __thiscall
indigox::algorithm::TDVertScore::IntroducePropagate
          (TDVertScore *this,shared_ptr<indigox::algorithm::TDVertScore> *a)

{
  ProperScoreMatrix *this_00;
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  void *pvVar3;
  MolVertPair v;
  TDVertScore *pTVar4;
  mapped_type *this_01;
  mapped_type *pmVar5;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
  *this_02;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
  *this_03;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  size_t count;
  BagScores tmpBags;
  BagMask iMask;
  BagMask newMask;
  MolVertPair introduced;
  uint local_104;
  TDVertScore *local_100;
  size_type local_f8;
  shared_ptr<indigox::algorithm::TDVertScore> *local_f0;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  local_e8;
  VertMask local_b8;
  size_t local_98;
  _Rb_tree_node_base *local_90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  key_type local_68;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  local_68.first = (this->tdProperties->kind).second.first;
  local_68.second = (this->tdProperties->kind).second.second;
  peVar2 = (a->super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_f0 = a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(this->fMask).m_bits,&(peVar2->fMask).m_bits);
  (this->fMask).m_num_bits = (peVar2->fMask).m_num_bits;
  this_01 = std::
            map<std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::at(&this->parent->pairMasks_,&local_68);
  local_f8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_01);
  local_b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = this->min_e;
  local_100 = this;
  if ((uint)local_b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start <= this->max_e) {
    p_Var1 = &local_e8._M_impl.super__Rb_tree_header;
    do {
      local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsig...:pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
      ::
      _M_emplace_unique<unsigned_int&,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>&>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsig___:pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
                  *)&this->score,(uint *)&local_b8,
                 (map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                  *)&local_e8);
      std::
      _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
      ::~_Rb_tree(&local_e8);
      local_b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           (uint)local_b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
    } while ((uint)local_b8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start <= local_100->max_e);
  }
  if (local_f8 != 0) {
    this_00 = &local_100->score;
    count = 1;
    do {
      pTVar4 = local_100;
      v.second = local_68.second;
      v.first = local_68.first;
      local_98 = count;
      IntroduceCountToMask(&local_b8,local_100,v,count);
      local_104 = pTVar4->min_e;
      if (local_104 <= pTVar4->max_e) {
        do {
          pmVar5 = std::
                   map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                   ::at(&((local_f0->
                          super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->score,&local_104);
          p_Var7 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          local_90 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header;
          if (p_Var7 != local_90) {
            do {
              boost::operator|(&local_88,
                               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (p_Var7 + 1),&local_b8);
              local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_e8._M_impl.super__Rb_tree_header._M_header;
              local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
              this_02 = (_Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                         *)std::
                           map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                           ::at(this_00,&local_104);
              std::
              _Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
              ::
              _M_emplace_unique<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>&>
                        (this_02,&local_88,
                         (multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          *)&local_e8);
              for (p_Var6 = p_Var7[2]._M_right; p_Var6 != (_Rb_tree_node_base *)&p_Var7[2]._M_parent
                  ; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
                pmVar5 = std::
                         map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                         ::at(this_00,&local_104);
                this_03 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                           *)std::
                             map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                             ::at(pmVar5,&local_88);
                boost::operator|(&local_50,
                                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &p_Var6[1]._M_parent,&local_b8);
                std::
                _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                ::
                _M_emplace_equal<unsigned_int_const&,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>
                          (this_03,&p_Var6[1]._M_color,&local_50);
                if (local_50.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_50.m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_50.m_bits.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_50.m_bits.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)&local_e8);
              if (local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_88.m_bits.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_88.m_bits.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            } while (p_Var7 != local_90);
          }
          local_104 = local_104 + 1;
        } while (local_104 <= local_100->max_e);
      }
      pvVar3 = (void *)CONCAT44(local_b8.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)local_b8.m_bits.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_b8.m_bits.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
      count = local_98 + 1;
    } while (count <= local_f8);
  }
  std::_Rb_tree<$4b2183d$>::clear
            (&(((local_f0->
                super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->score)._M_t);
  return;
}

Assistant:

void TDVertScore::IntroducePropagate(std::shared_ptr<TDVertScore> a)
{
  MolVertPair introduced = tdProperties->kind.second;
  fMask = a->fMask;
  size_t count = parent->pairMasks_.at(introduced).count();
  for (uint32_t e = min_e; e <= max_e; ++e) {
    BagScores tmpBags;
    score.emplace(e, tmpBags);
  }
  
  for (size_t i = 1; i <= count; ++i) {
    BagMask iMask = IntroduceCountToMask(introduced, i);
    for (uint32_t e = min_e; e <= max_e; ++e) {
      for (auto& bmask : a->score.at(e)) {
        BagMask newMask = bmask.first | iMask;
        MaskScores tmpScores;
        score.at(e).emplace(newMask, tmpScores);
        for (auto& ms : bmask.second) {
          score.at(e).at(newMask).emplace(ms.first, ms.second | iMask);
        }
      }
    }
  }
  a->score.clear();
}